

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O0

Index __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
::_positive_negative_vine_swap
          (Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
           *this,Index columnIndex1,Index columnIndex2)

{
  Master_chain_matrix *this_00;
  Index columnIndex2_local;
  Index columnIndex1_local;
  Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
  *this_local;
  
  this_00 = _matrix(this);
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
  ::add_to(this_00,columnIndex1,columnIndex2);
  return columnIndex1;
}

Assistant:

inline typename Chain_vine_swap<Master_matrix>::Index Chain_vine_swap<Master_matrix>::_positive_negative_vine_swap(
    Index columnIndex1, Index columnIndex2)
{
  _matrix()->add_to(columnIndex1, columnIndex2);

  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
    ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

    CP::positive_negative_transpose(pivot1, pivot2);
    CP::swap_positions(pivot1, pivot2);
  }

  return columnIndex1;
}